

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O0

int mod2dense_forcibly_invert(mod2dense *m,mod2dense *r,int *a_row,int *a_col)

{
  undefined4 uVar1;
  mod2word *pmVar2;
  mod2word *pmVar3;
  int col;
  uint value;
  int iVar4;
  long in_RCX;
  long in_RDX;
  mod2dense *in_RSI;
  mod2dense *in_RDI;
  int c;
  int u;
  int b0;
  int k0;
  int w;
  int n;
  int k;
  int j;
  int i;
  mod2word *t;
  mod2word *s;
  int local_54;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int row;
  uint uVar5;
  int in_stack_ffffffffffffffc4;
  uint local_38;
  uint local_34;
  
  if (in_RDI->n_rows != in_RDI->n_cols) {
    fprintf(_stderr,"mod2dense_forcibly_invert: Matrix to invert is not square\n");
    exit(1);
  }
  if (in_RSI != in_RDI) {
    uVar5 = in_RDI->n_rows;
    row = in_RDI->n_words;
    if ((in_RSI->n_rows == uVar5) && (in_RSI->n_cols == uVar5)) {
      mod2dense_clear(in_RSI);
      for (local_34 = 0; (int)local_34 < (int)uVar5; local_34 = local_34 + 1) {
        mod2dense_set((mod2dense *)CONCAT44(in_stack_ffffffffffffffc4,uVar5),row,
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      }
      for (local_34 = 0; (int)local_34 < (int)uVar5; local_34 = local_34 + 1) {
        *(undefined4 *)(in_RDX + (long)(int)local_34 * 4) = 0xffffffff;
        *(uint *)(in_RCX + (long)(int)local_34 * 4) = local_34;
      }
      for (local_34 = 0; (int)local_34 < (int)uVar5; local_34 = local_34 + 1) {
        col = (int)local_34 >> 5;
        value = local_34 & 0x1f;
        local_38 = local_34;
        while (((int)local_38 < (int)uVar5 &&
               ((in_RDI->col[(int)local_38][col] >> (sbyte)value & 1) == 0))) {
          local_38 = local_38 + 1;
        }
        if (local_38 == uVar5) {
          local_38 = local_34;
          mod2dense_set((mod2dense *)CONCAT44(in_stack_ffffffffffffffc4,uVar5),row,col,value);
          *(uint *)(in_RDX + (long)(int)local_34 * 4) = local_34;
        }
        if (local_38 != local_34) {
          pmVar2 = in_RDI->col[(int)local_34];
          in_RDI->col[(int)local_34] = in_RDI->col[(int)local_38];
          in_RDI->col[(int)local_38] = pmVar2;
          pmVar2 = in_RSI->col[(int)local_34];
          in_RSI->col[(int)local_34] = in_RSI->col[(int)local_38];
          in_RSI->col[(int)local_38] = pmVar2;
          uVar1 = *(undefined4 *)(in_RCX + (long)(int)local_34 * 4);
          *(undefined4 *)(in_RCX + (long)(int)local_34 * 4) =
               *(undefined4 *)(in_RCX + (long)(int)local_38 * 4);
          *(undefined4 *)(in_RCX + (long)(int)local_38 * 4) = uVar1;
        }
        for (local_38 = 0; (int)local_38 < (int)uVar5; local_38 = local_38 + 1) {
          if ((local_38 != local_34) &&
             ((in_RDI->col[(int)local_38][col] >> ((byte)value & 0x1f) & 1) != 0)) {
            pmVar2 = in_RDI->col[(int)local_38];
            pmVar3 = in_RDI->col[(int)local_34];
            for (iVar4 = col; iVar4 < row; iVar4 = iVar4 + 1) {
              pmVar2[iVar4] = pmVar3[iVar4] ^ pmVar2[iVar4];
            }
            pmVar2 = in_RSI->col[(int)local_38];
            pmVar3 = in_RSI->col[(int)local_34];
            for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < row;
                in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
              pmVar2[in_stack_ffffffffffffffc4] =
                   pmVar3[in_stack_ffffffffffffffc4] ^ pmVar2[in_stack_ffffffffffffffc4];
            }
          }
        }
      }
      local_54 = 0;
      for (local_34 = 0; (int)local_34 < (int)uVar5; local_34 = local_34 + 1) {
        if (*(int *)(in_RDX + (long)(int)local_34 * 4) != -1) {
          *(undefined4 *)(in_RDX + (long)local_54 * 4) =
               *(undefined4 *)(in_RDX + (long)(int)local_34 * 4);
          *(undefined4 *)(in_RCX + (long)local_54 * 4) =
               *(undefined4 *)(in_RCX + (long)(int)local_34 * 4);
          local_54 = local_54 + 1;
        }
      }
      return local_54;
    }
    fprintf(_stderr,"mod2dense_forcibly_invert: Matrix to receive inverse has wrong dimensions\n");
    exit(1);
  }
  fprintf(_stderr,"mod2dense_forcibly_invert: Result matrix is the same as the operand\n");
  exit(1);
}

Assistant:

int mod2dense_forcibly_invert 
( mod2dense *m, 	/* The matrix to find the inverse of (destroyed) */
  mod2dense *r,		/* Place to store the inverse */
  int *a_row,		/* Place to store row indexes of altered elements */
  int *a_col		/* Place to store column indexes of altered elements */
)
{
  mod2word *s, *t;
  int i, j, k, n, w, k0, b0;
  int u, c;

  if (mod2dense_rows(m)!=mod2dense_cols(m))
  { fprintf(stderr,
      "mod2dense_forcibly_invert: Matrix to invert is not square\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
      "mod2dense_forcibly_invert: Result matrix is the same as the operand\n");
    exit(1);
  }

  n = mod2dense_rows(m);
  w = m->n_words;

  if (mod2dense_rows(r)!=n || mod2dense_cols(r)!=n)
  { fprintf(stderr,
 "mod2dense_forcibly_invert: Matrix to receive inverse has wrong dimensions\n");
    exit(1);
  }

  mod2dense_clear(r);
  for (i = 0; i<n; i++) 
  { mod2dense_set(r,i,i,1);
  }

  for (i = 0; i<n; i++)
  { a_row[i] = -1;
    a_col[i] = i;
  }

  for (i = 0; i<n; i++)
  { 
    k0 = i >> mod2_wordsize_shift;
    b0 = i & mod2_wordsize_mask;

    for (j = i; j<n; j++) 
    { if (mod2_getbit(m->col[j][k0],b0)) break;
    }

    if (j==n)
    { j = i;
      mod2dense_set(m,i,j,1);
      a_row[i] = i;
    }

    if (j!=i)
    { 
      t = m->col[i];
      m->col[i] = m->col[j];
      m->col[j] = t;

      t = r->col[i];
      r->col[i] = r->col[j];
      r->col[j] = t;

      u = a_col[i];
      a_col[i] = a_col[j];
      a_col[j] = u;
    }

    for (j = 0; j<n; j++)
    { if (j!=i && mod2_getbit(m->col[j][k0],b0))
      { s = m->col[j];
        t = m->col[i];
        for (k = k0; k<w; k++) s[k] ^= t[k];
        s = r->col[j];
        t = r->col[i];
        for (k = 0; k<w; k++) s[k] ^= t[k];
      }
    }
  }

  c = 0;
  for (i = 0; i<n; i++)
  { if (a_row[i]!=-1)
    { a_row[c] = a_row[i];
      a_col[c] = a_col[i];
      c += 1;
    }
  }

  return c;
}